

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

void Ssw_SmlObjAssignConstWord(Ssw_Sml_t *p,Aig_Obj_t *pObj,int fConst1,int iFrame,int iWord)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  uint *pSims;
  int iWord_local;
  int iFrame_local;
  int fConst1_local;
  Aig_Obj_t *pObj_local;
  Ssw_Sml_t *p_local;
  
  if (p->nFrames <= iFrame) {
    __assert_fail("iFrame < p->nFrames",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x249,"void Ssw_SmlObjAssignConstWord(Ssw_Sml_t *, Aig_Obj_t *, int, int, int)");
  }
  if (iWord < p->nWordsFrame) {
    iVar1 = Aig_ObjIsCi(pObj);
    if (iVar1 != 0) {
      puVar2 = Ssw_ObjSim(p,pObj->Id);
      uVar3 = 0;
      if (fConst1 != 0) {
        uVar3 = 0xffffffff;
      }
      puVar2[(long)(p->nWordsFrame * iFrame) + (long)iWord] = uVar3;
      return;
    }
    __assert_fail("Aig_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x24b,"void Ssw_SmlObjAssignConstWord(Ssw_Sml_t *, Aig_Obj_t *, int, int, int)");
  }
  __assert_fail("iWord < p->nWordsFrame",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                ,0x24a,"void Ssw_SmlObjAssignConstWord(Ssw_Sml_t *, Aig_Obj_t *, int, int, int)");
}

Assistant:

void Ssw_SmlObjAssignConstWord( Ssw_Sml_t * p, Aig_Obj_t * pObj, int fConst1, int iFrame, int iWord )
{
    unsigned * pSims;
    assert( iFrame < p->nFrames );
    assert( iWord < p->nWordsFrame );
    assert( Aig_ObjIsCi(pObj) );
    pSims = Ssw_ObjSim( p, pObj->Id ) + p->nWordsFrame * iFrame;
    pSims[iWord] = fConst1? ~(unsigned)0 : 0;
}